

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::set_default_palette(Image *this,uint indices)

{
  undefined1 auVar1 [16];
  byte bVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_1c;
  channel_t value;
  uint i;
  channel_t add;
  uint indices_local;
  Image *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->_palette,(ulong)indices);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_palette);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  local_1c = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_palette);
    if (sVar3 <= local_1c) break;
    bVar2 = SUB161((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar1,0) * (char)local_1c;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_palette,(ulong)local_1c);
    *pvVar4 = (bVar2 - 0x1000000) + (uint)bVar2 * 0x100 + (uint)bVar2 * 0x10000;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Image::set_default_palette(const unsigned indices) {
  _palette.resize(indices);
  channel_t add = 0x100 / _palette.size();
  for (unsigned i = 0; i < _palette.size(); ++i) {
    channel_t value = add * i;
    _palette[i] = (rgba_t)(0xff000000 + value + (value << 8) + (value << 16));
  }
}